

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_conn.cc
# Opt level: O2

void __thiscall CSocekt::inRecyConnectQueue(CSocekt *this,lp_connection_t pConn)

{
  list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *this_00;
  _List_node_base *p_Var1;
  time_t tVar2;
  MutexLockGuard lock;
  MutexLockGuard local_28;
  lp_connection_t local_20;
  
  local_28.mutex_ = &this->m_recyconnqueueMutex;
  local_20 = pConn;
  muduo::MutexLock::lock(local_28.mutex_);
  this_00 = &this->m_recyconnectionList;
  p_Var1 = (_List_node_base *)this_00;
  do {
    p_Var1 = (((_List_base<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)
              &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this_00) {
      tVar2 = time((time_t *)0x0);
      pConn->inRecyTime = tVar2;
      pConn->iCurrsequence = pConn->iCurrsequence + 1;
      std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::push_back
                (this_00,&local_20);
      LOCK();
      (this->m_total_recyconnection_n).value_ = (this->m_total_recyconnection_n).value_ + 1;
      UNLOCK();
      break;
    }
  } while ((lp_connection_t)p_Var1[1]._M_next != pConn);
  muduo::MutexLockGuard::~MutexLockGuard(&local_28);
  return;
}

Assistant:

void CSocekt::inRecyConnectQueue(lp_connection_t pConn)
{
    //ngx_log_stderr(0,"CSocekt::inRecyConnectQueue()执行，连接入到回收队列中.");
    
  //  std::list<lp_connection_t>::iterator pos;
    bool iffind = false;
    muduo::MutexLockGuard lock(m_recyconnqueueMutex); //针对连接回收列表的互斥量，因为线程ServerRecyConnectionThread()也有要用到这个回收列表；

    //先检查一下这个连接之前在不在队列中，防止被重复添加
    for(auto pos = m_recyconnectionList.begin(); pos != m_recyconnectionList.end(); pos++)
    {
        if((*pos) == pConn)
        {
            iffind = true;
            break;
        }
    }

    if(iffind == true)
    return ;

    pConn->inRecyTime = time(NULL);        //记录回收时间
    ++pConn->iCurrsequence;
    m_recyconnectionList.push_back(pConn); //等待ServerRecyConnectionThread线程自会处理 
    m_total_recyconnection_n.increment();            //待释放连接队列大小+1
    return;
}